

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

ParsingResult * __thiscall
QLocaleData::validateChars
          (ParsingResult *__return_storage_ptr__,QLocaleData *this,QStringView str,
          NumberMode numMode,int decDigits,NumberOptions number_options)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  long in_FS_OFFSET;
  bool bVar5;
  char c;
  NumericTokenizer tokens;
  ParsingResult local_158;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_158,0xaa,0x120);
  local_158.state = Invalid;
  local_158.buff.super_QVLABase<char>.super_QVLABaseBase.a = 0x100;
  local_158.buff.super_QVLABase<char>.super_QVLABaseBase.s = 0;
  local_158.buff.super_QVLABase<char>.super_QVLABaseBase.ptr =
       &local_158.buff.super_QVLAStorage<1UL,_1UL,_256LL>;
  QVarLengthArray<char,_256LL>::reserve(&local_158.buff,str.m_size);
  memset(&tokens,0xaa,0xd8);
  numericData((NumericData *)&c,this,numMode);
  anon_unknown.dwarf_b4927a::NumericTokenizer::NumericTokenizer
            (&tokens,str,(NumericData *)&c,numMode);
  NumericData::~NumericData((NumericData *)&c);
  iVar4 = 0;
  bVar3 = 0;
LAB_002e0998:
  do {
    while( true ) {
      if (tokens.m_text.m_size <= tokens.m_index) {
        local_158.state = Acceptable;
        if ((bVar3 - 0x2b < 0x3b) &&
           ((0x400000000000007U >> ((ulong)(bVar3 - 0x2b) & 0x3f) & 1) != 0)) {
          local_158.state = Intermediate;
        }
        ParsingResult::ParsingResult(__return_storage_ptr__,&local_158);
        goto LAB_002e0b10;
      }
      bVar1 = anon_unknown.dwarf_b4927a::NumericTokenizer::nextToken(&tokens);
      iVar2 = (int)(char)bVar3;
      c = bVar1;
      if (9 < (int)(char)bVar1 - 0x30U) break;
      if (iVar4 == 1) {
        iVar4 = 1;
        bVar5 = decDigits == 0;
        decDigits = decDigits + -1;
        if (bVar5) goto LAB_002e0af3;
      }
      else if ((iVar4 == 2) && (iVar4 = 2, bVar1 == 0x30 && iVar2 - 0x3aU < 0xfffffff6)) {
        if (((uint)number_options.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                   super_QFlagsStorage<QLocale::NumberOption>.i & 8) == 0) goto LAB_002e0a9b;
        goto LAB_002e0af3;
      }
LAB_002e0a47:
      bVar3 = bVar1;
      if (bVar1 != 0x2c) goto LAB_002e0a9b;
    }
    switch(bVar1) {
    case 0x2b:
    case 0x2d:
      if ((bVar3 == 0) || (numMode == DoubleScientificMode && bVar3 == 0x65)) goto LAB_002e0a47;
      goto LAB_002e0af3;
    case 0x2c:
      goto switchD_002e0a1d_caseD_2c;
    case 0x2e:
      if ((numMode == IntegerMode) || (bVar5 = iVar4 != 0, iVar4 = 1, bVar5)) {
LAB_002e0af3:
        __return_storage_ptr__->state = Invalid;
        (__return_storage_ptr__->buff).super_QVLABase<char>.super_QVLABaseBase.a = 0x100;
        (__return_storage_ptr__->buff).super_QVLABase<char>.super_QVLABaseBase.s = 0;
        (__return_storage_ptr__->buff).super_QVLABase<char>.super_QVLABaseBase.ptr =
             &(__return_storage_ptr__->buff).super_QVLAStorage<1UL,_1UL,_256LL>;
LAB_002e0b10:
        NumericData::~NumericData(&tokens.m_guide);
        QVarLengthArray<char,_256LL>::~QVarLengthArray(&local_158.buff);
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
          __stack_chk_fail();
        }
        return __return_storage_ptr__;
      }
      break;
    default:
      if (((bVar1 != 0x65) || (numMode != DoubleScientificMode)) ||
         (bVar5 = iVar4 == 2, iVar4 = 2, bVar5)) goto LAB_002e0af3;
    }
LAB_002e0a9b:
    QVarLengthArray<char,_256LL>::append(&local_158.buff,&c);
    bVar3 = bVar1;
  } while( true );
switchD_002e0a1d_caseD_2c:
  if ((((uint)number_options.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
              super_QFlagsStorage<QLocale::NumberOption>.i & 2) != 0 || iVar4 != 0) ||
     (iVar4 = 0, bVar3 = bVar1, 9 < iVar2 - 0x30U)) goto LAB_002e0af3;
  goto LAB_002e0998;
}

Assistant:

ParsingResult
QLocaleData::validateChars(QStringView str, NumberMode numMode, int decDigits,
                           QLocale::NumberOptions number_options) const
{
    ParsingResult result;
    result.buff.reserve(str.size());

    enum { Whole, Fractional, Exponent } state = Whole;
    const bool scientific = numMode == DoubleScientificMode;
    NumericTokenizer tokens(str, numericData(numMode), numMode);
    char last = '\0';

    while (!tokens.done()) {
        char c = tokens.nextToken();

        if (isAsciiDigit(c)) {
            switch (state) {
            case Whole:
                // Nothing special to do (unless we want to check grouping sizes).
                break;
            case Fractional:
                // If a double has too many digits in its fractional part it is Invalid.
                if (decDigits-- == 0)
                    return {};
                break;
            case Exponent:
                if (!isAsciiDigit(last)) {
                    // This is the first digit in the exponent (there may have beena '+'
                    // or '-' in before). If it's a zero, the exponent is zero-padded.
                    if (c == '0' && (number_options & QLocale::RejectLeadingZeroInExponent))
                        return {};
                }
                break;
            }

        } else {
            switch (c) {
            case '.':
                // If an integer has a decimal point, it is Invalid.
                // A double can only have one, at the end of its whole-number part.
                if (numMode == IntegerMode || state != Whole)
                    return {};
                // Even when decDigits is 0, we do allow the decimal point to be
                // present - just as long as no digits follow it.

                state = Fractional;
                break;

            case '+':
            case '-':
                // A sign can only appear at the start or after the e of scientific:
                if (last != '\0' && !(scientific && last == 'e'))
                    return {};
                break;

            case ',':
                // Grouping is only allowed after a digit in the whole-number portion:
                if ((number_options & QLocale::RejectGroupSeparator) || state != Whole
                        || !isAsciiDigit(last)) {
                    return {};
                }
                // We could check grouping sizes are correct, but fixup()s are
                // probably better off correcting any misplacement instead.
                break;

            case 'e':
                // Only one e is allowed and only in scientific:
                if (!scientific || state == Exponent)
                    return {};
                state = Exponent;
                break;

            default:
                // Nothing else can validly appear in a number.
                // NumericTokenizer allows letters of "inf" and "nan", but
                // validators don't accept those values.
                // For anything else, tokens.nextToken() must have returned 0.
                Q_ASSERT(!c || c == 'a' || c == 'f' || c == 'i' || c == 'n');
                return {};
            }
        }

        last = c;
        if (c != ',') // Skip grouping
            result.buff.append(c);
    }

    result.state = ParsingResult::Acceptable;

    // Intermediate if it ends with any character that requires a digit after
    // it to be valid e.g. group separator, sign, or exponent
    if (last == ',' || last == '-' || last == '+' || last == 'e')
        result.state = ParsingResult::Intermediate;

    return result;
}